

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zesFirmwareGetConsoleLogs(zes_firmware_handle_t hFirmware,size_t *pSize,char *pFirmwareLog)

{
  ze_result_t zVar1;
  
  if (DAT_0010ec80 != (code *)0x0) {
    zVar1 = (*DAT_0010ec80)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFirmwareGetConsoleLogs(
        zes_firmware_handle_t hFirmware,                ///< [in] Handle for the component.
        size_t* pSize,                                  ///< [in,out] size of firmware log
        char* pFirmwareLog                              ///< [in,out][optional] pointer to null-terminated string of the log.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetConsoleLogs = context.zesDdiTable.Firmware.pfnGetConsoleLogs;
        if( nullptr != pfnGetConsoleLogs )
        {
            result = pfnGetConsoleLogs( hFirmware, pSize, pFirmwareLog );
        }
        else
        {
            // generic implementation
        }

        return result;
    }